

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *Cluster,ebml_master *SegmentInfo)

{
  ebml_master *Element;
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_master *local_18;
  ebml_master *SegmentInfo_local;
  matroska_cluster *Cluster_local;
  
  local_18 = SegmentInfo;
  SegmentInfo_local = &Cluster->Base;
  peVar1 = MATROSKA_getContextCluster();
  bVar2 = EBML_ElementIsType((ebml_element *)Cluster,peVar1);
  Element = local_18;
  if (bVar2 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)Cluster, MATROSKA_getContextCluster())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x1eb,
                  "err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *, ebml_master *)");
  }
  peVar1 = MATROSKA_getContextInfo();
  bVar2 = EBML_ElementIsType(&Element->Base,peVar1);
  if (bVar2 != 0) {
    if (SegmentInfo_local != (ebml_master *)0x0) {
      (**(code **)((long)(SegmentInfo_local->Base).Base.Base.VMT + 0x20))
                (SegmentInfo_local,0x101,&local_18,8);
      return 0;
    }
    __assert_fail("(const void*)(Cluster)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x1ed,
                  "err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *, ebml_master *)");
  }
  __assert_fail("EBML_ElementIsType((ebml_element*)SegmentInfo, MATROSKA_getContextInfo())",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x1ec,
                "err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *, ebml_master *)");
}

Assistant:

err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *Cluster, ebml_master *SegmentInfo)
{
    assert(EBML_ElementIsType((ebml_element*)Cluster, MATROSKA_getContextCluster()));
    assert(EBML_ElementIsType((ebml_element*)SegmentInfo, MATROSKA_getContextInfo()));
    Node_SET(Cluster,MATROSKA_CLUSTER_WRITE_SEGMENTINFO,&SegmentInfo);
    return ERR_NONE;
}